

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

void __thiscall
cbtDbvt::rayTestInternal
          (cbtDbvt *this,cbtDbvtNode *root,cbtVector3 *rayFrom,cbtVector3 *rayTo,
          cbtVector3 *rayDirectionInverse,uint *signs,cbtScalar lambda_max,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax,cbtAlignedObjectArray<const_cbtDbvtNode_*> *stack,ICollide *policy)

{
  cbtDbvtNode *v1;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  cbtVector3 cVar12;
  int local_74;
  cbtScalar tmin;
  uint *local_68;
  cbtDbvtNode *local_60;
  cbtVector3 local_58;
  undefined1 local_48 [16];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = lambda_max;
  if (root != (cbtDbvtNode *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58.m_floats._0_8_;
    local_58.m_floats = (cbtScalar  [4])(auVar1 << 0x40);
    local_68 = signs;
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::resize(stack,0x80,(cbtDbvtNode **)&local_58);
    *stack->m_data = root;
    iVar3 = 1;
    local_74 = 0x7e;
    do {
      auVar11 = in_ZMM1._8_56_;
      auVar8 = auVar7._8_56_;
      iVar4 = iVar3 + -1;
      v1 = stack->m_data[(long)iVar3 + -1];
      cVar12 = ::operator-((cbtVector3 *)v1,aabbMax);
      auVar9._0_8_ = cVar12.m_floats._8_8_;
      auVar9._8_56_ = auVar11;
      auVar5._0_8_ = cVar12.m_floats._0_8_;
      auVar5._8_56_ = auVar8;
      local_58.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar9._0_16_);
      auVar8 = ZEXT856(local_58.m_floats._8_8_);
      cVar12 = ::operator-(&(v1->volume).mx,aabbMin);
      auVar10._0_8_ = cVar12.m_floats._8_8_;
      auVar10._8_56_ = auVar11;
      auVar6._0_8_ = cVar12.m_floats._0_8_;
      auVar6._8_56_ = auVar8;
      local_48 = vmovlhps_avx(auVar6._0_16_,auVar10._0_16_);
      in_ZMM1 = ZEXT464((uint)lambda_max);
      tmin = 1.0;
      auVar7 = ZEXT864(0) << 0x20;
      bVar2 = cbtRayAabb2(rayFrom,rayDirectionInverse,local_68,&local_58,&tmin,0.0,lambda_max);
      if (bVar2) {
        if (*(long *)((long)&v1->field_2 + 8) == 0) {
          (*policy->_vptr_ICollide[3])(policy,v1);
        }
        else {
          if (local_74 < iVar4) {
            local_60 = (cbtDbvtNode *)0x0;
            cbtAlignedObjectArray<const_cbtDbvtNode_*>::resize(stack,stack->m_size * 2,&local_60);
            local_74 = stack->m_size + -2;
          }
          stack->m_data[(long)iVar3 + -1] = (v1->field_2).childs[0];
          stack->m_data[iVar3] = *(cbtDbvtNode **)((long)&v1->field_2 + 8);
          iVar4 = iVar3 + 1;
        }
      }
      iVar3 = iVar4;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::rayTestInternal(const cbtDbvtNode* root,
									const cbtVector3& rayFrom,
									const cbtVector3& rayTo,
									const cbtVector3& rayDirectionInverse,
									unsigned int signs[3],
									cbtScalar lambda_max,
									const cbtVector3& aabbMin,
									const cbtVector3& aabbMax,
									cbtAlignedObjectArray<const cbtDbvtNode*>& stack,
									DBVT_IPOLICY) const
{
	(void)rayTo;
	DBVT_CHECKTYPE
	if (root)
	{
		cbtVector3 resultNormal;

		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 2;
		stack.resize(DOUBLE_STACKSIZE);
		stack[0] = root;
		cbtVector3 bounds[2];
		do
		{
			const cbtDbvtNode* node = stack[--depth];
			bounds[0] = node->volume.Mins() - aabbMax;
			bounds[1] = node->volume.Maxs() - aabbMin;
			cbtScalar tmin = 1.f, lambda_min = 0.f;
			unsigned int result1 = false;
			result1 = cbtRayAabb2(rayFrom, rayDirectionInverse, signs, bounds, tmin, lambda_min, lambda_max);
			if (result1)
			{
				if (node->isinternal())
				{
					if (depth > treshold)
					{
						stack.resize(stack.size() * 2);
						treshold = stack.size() - 2;
					}
					stack[depth++] = node->childs[0];
					stack[depth++] = node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while (depth);
	}
}